

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::~IfcCurveBoundedPlane(IfcCurveBoundedPlane *this)

{
  pointer pLVar1;
  
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCurveBoundedPlane_00970560;
  *(undefined ***)&this->field_0x78 = &PTR__IfcCurveBoundedPlane_00970628;
  *(undefined ***)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcCurveBoundedPlane_00970588;
  *(undefined ***)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcCurveBoundedPlane_009705b0;
  *(undefined ***)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30
       = &PTR__IfcCurveBoundedPlane_009705d8;
  *(undefined ***)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 =
       &PTR__IfcCurveBoundedPlane_00970600;
  pLVar1 = (this->InnerBoundaries).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1,(long)(this->InnerBoundaries).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar1);
  }
  operator_delete(this,0x90);
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}